

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O1

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::clear
          (mem_cache<cppcms::impl::process_settings> *this)

{
  shared_mutex *this_00;
  
  this_00 = (this->access_lock)._M_t.
            super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
            ._M_t.
            super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
            .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  shared_mutex::wrlock(this_00);
  nl_clear(this);
  shared_mutex::unlock(this_00);
  return;
}

Assistant:

virtual void clear()
	{
		wrlock_guard lock(*access_lock);
		nl_clear();
	}